

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O3

aiVector2D __thiscall Assimp::XGLImporter::ReadVec2(XGLImporter *this)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  byte *c;
  byte *pbVar5;
  ulong uVar6;
  bool bVar7;
  aiVector2D *paVar8;
  ai_real v [2];
  float local_3c;
  aiVector2D local_38;
  
  bVar3 = SkipToText(this);
  if (bVar3) {
    iVar4 = (*((this->m_reader).
               super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->_vptr_IIrrXMLReader[0xe])();
    c = (byte *)CONCAT44(extraout_var,iVar4);
    paVar8 = &local_38;
    bVar2 = 0;
    bVar3 = true;
LAB_005ccf2e:
    do {
      bVar7 = bVar3;
      uVar6 = (ulong)*c;
      if (uVar6 < 0x21) {
        if ((0x100000200U >> (uVar6 & 0x3f) & 1) != 0) {
          c = c + 1;
          bVar3 = bVar7;
          goto LAB_005ccf2e;
        }
        if ((0x3401UL >> (uVar6 & 0x3f) & 1) != 0) goto LAB_005ccfb6;
      }
      local_3c = 0.0;
      pbVar5 = (byte *)fast_atoreal_move<float>((char *)c,&local_3c,true);
      paVar8->x = local_3c;
      do {
        do {
          c = pbVar5 + 1;
          bVar1 = *pbVar5;
          pbVar5 = c;
        } while (bVar1 == 0x20);
      } while (bVar1 == 9);
      if (!(bool)(bVar2 | bVar1 == 0x2c)) goto LAB_005ccfb6;
      bVar2 = 1;
      paVar8 = (aiVector2D *)&local_38.y;
      bVar3 = false;
    } while (bVar7);
  }
  else {
LAB_005ccfb6:
    LogFunctions<Assimp::XGLImporter>::LogError((char *)0x5ccfbb);
    local_38.x = 0.0;
    local_38.y = 0.0;
  }
  return local_38;
}

Assistant:

aiVector2D XGLImporter::ReadVec2()
{
    aiVector2D vec;

    if(!SkipToText()) {
        LogError("unexpected EOF reading vec2 contents");
        return vec;
    }
    const char* s = m_reader->getNodeData();

    ai_real v[2];
	for(int i = 0; i < 2; ++i) {
        if(!SkipSpaces(&s)) {
            LogError("unexpected EOL, failed to parse vec2");
            return vec;
        }
		
        v[i] = fast_atof(&s);

        SkipSpaces(&s);
        if (i != 1 && *s != ',') {
            LogError("expected comma, failed to parse vec2");
            return vec;
        }
        ++s;
    }
	vec.x = v[0];
	vec.y = v[1];

    return vec;
}